

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool do_pfirst_pnext(DisasContext_conflict1 *s,arg_rr_esz *a,
                     _func_void_TCGContext_ptr_TCGv_i32_TCGv_ptr_TCGv_ptr_TCGv_i32 *gen_fn)

{
  int iVar1;
  uint uVar2;
  TCGContext_conflict1 *s_00;
  _Bool _Var3;
  undefined1 extraout_AL;
  int iVar4;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGv_i32 t;
  uintptr_t o;
  
  s_00 = s->uc->tcg_ctx;
  _Var3 = sve_access_check_aarch64(s);
  if (_Var3) {
    ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    ts_00 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    iVar4 = s->sve_len >> 3;
    iVar1 = iVar4 + 7;
    iVar4 = iVar4 + 0xe;
    if (-1 < iVar1) {
      iVar4 = iVar1;
    }
    uVar2 = a->esz;
    tcg_gen_addi_i64_aarch64
              (s_00,(TCGv_i64)((long)ts - (long)s_00),(TCGv_i64)s_00->cpu_env,
               (long)(a->rd * 0x20 + 0x2c10));
    tcg_gen_addi_i64_aarch64
              (s_00,(TCGv_i64)((long)ts_00 - (long)s_00),(TCGv_i64)s_00->cpu_env,
               (long)(a->rn * 0x20 + 0x2c10));
    t = tcg_const_i32_aarch64(s_00,(uVar2 & 3) << 10 | iVar4 >> 3 & 0xfffff3ffU);
    (*gen_fn)(s_00,t,(TCGv_ptr)((long)ts - (long)s_00),(TCGv_ptr)((long)ts_00 - (long)s_00),t);
    tcg_temp_free_internal_aarch64(s_00,ts);
    tcg_temp_free_internal_aarch64(s_00,ts_00);
    do_pred_flags(s_00,t);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(t + (long)s_00));
    return (_Bool)extraout_AL;
  }
  return _Var3;
}

Assistant:

static bool do_pfirst_pnext(DisasContext *s, arg_rr_esz *a,
                            void (*gen_fn)(TCGContext *, TCGv_i32, TCGv_ptr,
                                           TCGv_ptr, TCGv_i32))
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!sve_access_check(s)) {
        return true;
    }

    TCGv_ptr t_pd = tcg_temp_new_ptr(tcg_ctx);
    TCGv_ptr t_pg = tcg_temp_new_ptr(tcg_ctx);
    TCGv_i32 t;
    unsigned desc;

    desc = DIV_ROUND_UP(pred_full_reg_size(s), 8);
    desc = deposit32(desc, SIMD_DATA_SHIFT, 2, a->esz);

    tcg_gen_addi_ptr(tcg_ctx, t_pd, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rd));
    tcg_gen_addi_ptr(tcg_ctx, t_pg, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rn));
    t = tcg_const_i32(tcg_ctx, desc);

    gen_fn(tcg_ctx, t, t_pd, t_pg, t);
    tcg_temp_free_ptr(tcg_ctx, t_pd);
    tcg_temp_free_ptr(tcg_ctx, t_pg);

    do_pred_flags(tcg_ctx, t);
    tcg_temp_free_i32(tcg_ctx, t);
    return true;
}